

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::handleExceptionMatchExpr
               (AssertionHandler *handler,StringMatcher *matcher,StringRef *matcherString)

{
  int iVar1;
  string exceptionMessage;
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  expr;
  string local_70 [32];
  undefined **local_50;
  undefined1 local_48;
  undefined1 local_47;
  string *local_40;
  StringMatcher *local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  translateActiveException_abi_cxx11_();
  iVar1 = (**(matcher->
             super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )._vptr_MatcherMethod)
                    (&matcher->
                      super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ,local_70);
  local_48 = 1;
  local_47 = (undefined1)iVar1;
  local_50 = &PTR_streamReconstructedExpression_001b6e88;
  local_30 = *(undefined4 *)&matcherString->m_start;
  uStack_2c = *(undefined4 *)((long)&matcherString->m_start + 4);
  uStack_28 = (undefined4)matcherString->m_size;
  uStack_24 = *(undefined4 *)((long)&matcherString->m_size + 4);
  local_40 = local_70;
  local_38 = matcher;
  (*handler->m_resultCapture->_vptr_IResultCapture[10])
            (handler->m_resultCapture,handler,&local_50,&handler->m_reaction);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, StringMatcher const& matcher, StringRef const& matcherString  ) {
        std::string exceptionMessage = Catch::translateActiveException();
        MatchExpr<std::string, StringMatcher const&> expr( exceptionMessage, matcher, matcherString );
        handler.handleExpr( expr );
    }